

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::CheckOpcode3
          (TypeChecker *this,Opcode opcode,Limits *limits1,Limits *limits2,Limits *limits3)

{
  Result RVar1;
  Type TVar2;
  Type expected2;
  Type expected3;
  char *desc;
  Opcode local_34;
  
  TVar2 = Opcode::GetParamType1(&local_34);
  if (limits1 != (Limits *)0x0) {
    TVar2 = (Type)~(ulong)limits1->is_64;
  }
  expected2 = Opcode::GetParamType2(&local_34);
  if (limits2 != (Limits *)0x0) {
    expected2 = (Type)~(ulong)limits2->is_64;
  }
  expected3 = Opcode::GetParamType3(&local_34);
  if (limits3 != (Limits *)0x0) {
    expected3 = (Type)~(ulong)limits3->is_64;
  }
  desc = Opcode::GetName(&local_34);
  RVar1 = PopAndCheck3Types(this,TVar2,expected2,expected3,desc);
  TVar2 = Opcode::GetResultType(&local_34);
  PushType(this,TVar2);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode,
                                 const Limits* limits1,
                                 const Limits* limits2,
                                 const Limits* limits3) {
  Result result = PopAndCheck3Types(
      GetMemoryParam(opcode.GetParamType1(), limits1),
      GetMemoryParam(opcode.GetParamType2(), limits2),
      GetMemoryParam(opcode.GetParamType3(), limits3), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}